

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void>::visit
          (ArgVisitor<fmt::internal::PrintfArgFormatter<wchar_t>,_void> *this,Arg *arg)

{
  unkbyte10 *pVar1;
  FormatSpec spec;
  FormatSpec spec_00;
  FormatSpec spec_01;
  FormatSpec spec_02;
  StringValue<wchar_t> local_18;
  undefined8 local_8;
  
  switch(arg->type) {
  case INT:
    pVar1 = *(unkbyte10 **)(this + 8);
    local_8 = *(undefined8 *)(pVar1 + 1);
    local_18.value = *(wchar_t **)pVar1;
    local_18.size = *(size_t *)((long)pVar1 + 8);
    spec._10_6_ = (int6)(local_18.size >> 0x10);
    spec.super_AlignSpec._0_10_ = *pVar1;
    spec.precision_ = (int)local_8;
    spec.type_ = (char)((ulong)local_8 >> 0x20);
    spec._21_3_ = (int3)((ulong)local_8 >> 0x28);
    BasicWriter<wchar_t>::write_int<int,fmt::FormatSpec>
              (*(BasicWriter<wchar_t> **)this,(arg->super_Value).field_0.int_value,spec);
    break;
  case UINT:
    pVar1 = *(unkbyte10 **)(this + 8);
    local_8 = *(undefined8 *)(pVar1 + 1);
    local_18.value = *(wchar_t **)pVar1;
    local_18.size = *(size_t *)((long)pVar1 + 8);
    spec_02._10_6_ = (int6)(local_18.size >> 0x10);
    spec_02.super_AlignSpec._0_10_ = *pVar1;
    spec_02.precision_ = (int)local_8;
    spec_02.type_ = (char)((ulong)local_8 >> 0x20);
    spec_02._21_3_ = (int3)((ulong)local_8 >> 0x28);
    BasicWriter<wchar_t>::write_int<unsigned_int,fmt::FormatSpec>
              (*(BasicWriter<wchar_t> **)this,(arg->super_Value).field_0.uint_value,spec_02);
    break;
  case LONG_LONG:
    pVar1 = *(unkbyte10 **)(this + 8);
    local_8 = *(undefined8 *)(pVar1 + 1);
    local_18.value = *(wchar_t **)pVar1;
    local_18.size = *(size_t *)((long)pVar1 + 8);
    spec_00._10_6_ = (int6)(local_18.size >> 0x10);
    spec_00.super_AlignSpec._0_10_ = *pVar1;
    spec_00.precision_ = (int)local_8;
    spec_00.type_ = (char)((ulong)local_8 >> 0x20);
    spec_00._21_3_ = (int3)((ulong)local_8 >> 0x28);
    BasicWriter<wchar_t>::write_int<long_long,fmt::FormatSpec>
              (*(BasicWriter<wchar_t> **)this,(arg->super_Value).field_0.long_long_value,spec_00);
    break;
  case ULONG_LONG:
    pVar1 = *(unkbyte10 **)(this + 8);
    local_8 = *(undefined8 *)(pVar1 + 1);
    local_18.value = *(wchar_t **)pVar1;
    local_18.size = *(size_t *)((long)pVar1 + 8);
    spec_01._10_6_ = (int6)(local_18.size >> 0x10);
    spec_01.super_AlignSpec._0_10_ = *pVar1;
    spec_01.precision_ = (int)local_8;
    spec_01.type_ = (char)((ulong)local_8 >> 0x20);
    spec_01._21_3_ = (int3)((ulong)local_8 >> 0x28);
    BasicWriter<wchar_t>::write_int<unsigned_long_long,fmt::FormatSpec>
              (*(BasicWriter<wchar_t> **)this,(arg->super_Value).field_0.ulong_long_value,spec_01);
    break;
  case BOOL:
    internal::PrintfArgFormatter<wchar_t>::visit_bool
              ((PrintfArgFormatter<wchar_t> *)this,(arg->super_Value).field_0.int_value != 0);
    return;
  case CHAR:
    internal::PrintfArgFormatter<wchar_t>::visit_char
              ((PrintfArgFormatter<wchar_t> *)this,(arg->super_Value).field_0.int_value);
    return;
  case DOUBLE:
    BasicWriter<wchar_t>::write_double<double>
              (*(BasicWriter<wchar_t> **)this,(arg->super_Value).field_0.double_value,
               *(FormatSpec **)(this + 8));
    return;
  case LAST_NUMERIC_TYPE:
    BasicWriter<wchar_t>::write_double<long_double>
              (*(BasicWriter<wchar_t> **)this,(arg->super_Value).field_0.long_double_value,
               *(FormatSpec **)(this + 8));
    break;
  case CSTRING:
    internal::PrintfArgFormatter<wchar_t>::visit_cstring
              ((PrintfArgFormatter<wchar_t> *)this,(arg->super_Value).field_0.string.value);
    return;
  case STRING:
    local_18.value = (wchar_t *)(arg->super_Value).field_0.long_long_value;
    local_18.size = (arg->super_Value).field_0.string.size;
    BasicWriter<wchar_t>::write_str<char>
              (*(BasicWriter<wchar_t> **)this,(StringValue<char> *)&local_18,
               *(FormatSpec **)(this + 8));
    break;
  case WSTRING:
    local_18.value = (wchar_t *)(arg->super_Value).field_0.long_long_value;
    local_18.size = (arg->super_Value).field_0.string.size;
    BasicWriter<wchar_t>::write_str<wchar_t>
              (*(BasicWriter<wchar_t> **)this,&local_18,*(FormatSpec **)(this + 8));
    break;
  case POINTER:
    internal::PrintfArgFormatter<wchar_t>::visit_pointer
              ((PrintfArgFormatter<wchar_t> *)this,(arg->super_Value).field_0.pointer);
    return;
  case CUSTOM:
    internal::PrintfArgFormatter<wchar_t>::visit_custom
              ((PrintfArgFormatter<wchar_t> *)this,(arg->super_Value).field_0.custom);
    return;
  }
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }